

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O1

void __thiscall cbtGImpactMeshShape::~cbtGImpactMeshShape(cbtGImpactMeshShape *this)

{
  ~cbtGImpactMeshShape(this);
  cbtAlignedFreeInternal(this);
  return;
}

Assistant:

virtual ~cbtGImpactMeshShape()
	{
		int i = m_mesh_parts.size();
		while (i--)
		{
			cbtGImpactMeshShapePart* part = m_mesh_parts[i];
			delete part;
		}
		m_mesh_parts.clear();
	}